

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::setFormFieldName
          (QPDFAcroFormDocumentHelper *this,QPDFFormFieldObjectHelper *ff,string *name)

{
  QPDFObjectHandle ff_oh;
  set visited;
  allocator<char> local_99;
  QPDFObjectHandle local_98;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  allocator<char> local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"/T",local_38);
  QPDFFormFieldObjectHelper::setFieldAttribute(ff,(string *)local_68,name);
  std::__cxx11::string::~string((string *)local_68);
  local_68._24_8_ = local_68 + 8;
  local_68._8_4_ = 0;
  local_68._16_8_ = 0;
  local_40 = 0;
  local_48 = (_Base_ptr)local_68._24_8_;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_78,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(ff->super_QPDFObjectHelper).super_BaseHandle);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"/Parent",&local_99);
  QPDFObjectHandle::getKey(&local_98,(string *)local_78);
  traverseField(this,(QPDFObjectHandle *)&local_88,&local_98,0,(set *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
               *)local_68);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::setFormFieldName(QPDFFormFieldObjectHelper ff, std::string const& name)
{
    ff.setFieldAttribute("/T", name);
    QPDFObjGen::set visited;
    auto ff_oh = ff.getObjectHandle();
    traverseField(ff_oh, ff_oh.getKey("/Parent"), 0, visited);
}